

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChNodeSPH::ArchiveIN(ChNodeSPH *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_c0;
  ChNameValue<double> local_a8;
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::collision::ChCollisionModel_*> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChNodeSPH>(marchive);
  ChNodeXYZ::ArchiveIN(&this->super_ChNodeXYZ,marchive);
  local_30._value = &this->collision_model;
  local_30._name = "collision_model";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->UserForce;
  local_48._name = "UserForce";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->volume;
  local_60._name = "volume";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->density;
  local_78._name = "density";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->h_rad;
  local_90._name = "h_rad";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  local_a8._value = &this->coll_rad;
  local_a8._name = "coll_rad";
  local_a8._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_a8);
  local_c0._value = &this->pressure;
  local_c0._name = "pressure";
  local_c0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_c0);
  return;
}

Assistant:

void ChNodeSPH::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeSPH>();

    // deserialize parent class
    ChNodeXYZ::ArchiveIN(marchive);

    // deserialize all member data:
    // marchive >> CHNVP(container);
    marchive >> CHNVP(collision_model);
    marchive >> CHNVP(UserForce);
    marchive >> CHNVP(volume);
    marchive >> CHNVP(density);
    marchive >> CHNVP(h_rad);
    marchive >> CHNVP(coll_rad);
    marchive >> CHNVP(pressure);
}